

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

bool __thiscall
Clasp::Solver::Dirty::add<Clasp::ClauseHead>
          (Dirty *this,ClauseHead **list,uintp other,Constraint *c)

{
  ClauseHead *pCVar1;
  __node_gen_type __node_gen;
  
  pCVar1 = *list;
  *list = (ClauseHead *)((ulong)pCVar1 | 1);
  if (this->last != c) {
    this->last = c;
    std::
    _Hashtable<Clasp::Constraint*,Clasp::Constraint*,std::allocator<Clasp::Constraint*>,std::__detail::_Identity,std::equal_to<Clasp::Constraint*>,std::hash<Clasp::Constraint*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<Clasp::Constraint*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Clasp::Constraint*,false>>>>
              ((_Hashtable<Clasp::Constraint*,Clasp::Constraint*,std::allocator<Clasp::Constraint*>,std::__detail::_Identity,std::equal_to<Clasp::Constraint*>,std::hash<Clasp::Constraint*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&this->cons,&this->last);
  }
  return (((uint)pCVar1 | (uint)other) & 1) == 0;
}

Assistant:

bool add(T*& list, uintp other, Constraint* c) {
		other |= reinterpret_cast<uintp>(list);
		list = reinterpret_cast<T*>( set_bit(reinterpret_cast<uintp>(list), 0) );
		if (c != last) { cons.insert(last = c); }
		return !test_bit(other, 0);
	}